

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7314::RtMidi_getapiname(lua_State *L)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Api api_00;
  undefined1 local_38 [8];
  string str;
  Api api;
  lua_State *L_local;
  
  str.field_2._12_4_ = luaL_checkinteger(L,1);
  RtMidi::getApiName_abi_cxx11_((string *)local_38,(RtMidi *)(ulong)(uint)str.field_2._12_4_,api_00)
  ;
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::size();
  lua_pushlstring(L,uVar1,uVar2);
  std::__cxx11::string::~string((string *)local_38);
  return 1;
}

Assistant:

int RtMidi_getapiname(lua_State *L) {
	auto api = static_cast<RtMidi::Api>(luaL_checkinteger(L, 1));
	auto str = RtMidi::getApiName(api);
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}